

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comment_PDU.cpp
# Opt level: O1

KBOOL __thiscall KDIS::PDU::Comment_PDU::operator==(Comment_PDU *this,Comment_PDU *Value)

{
  pointer pKVar1;
  pointer pKVar2;
  pointer pKVar3;
  FixedDatum *pFVar4;
  pointer pKVar5;
  pointer pKVar6;
  VariableDatum *pVVar7;
  pointer pKVar8;
  KBOOL KVar9;
  pointer pKVar10;
  FixedDatum **ppFVar11;
  VariableDatum **ppVVar12;
  bool bVar13;
  
  KVar9 = Simulation_Management_Header::operator!=
                    (&this->super_Simulation_Management_Header,
                     &Value->super_Simulation_Management_Header);
  if (((!KVar9) && (this->m_ui32NumFixedDatum == Value->m_ui32NumFixedDatum)) &&
     (this->m_ui32NumVariableDatum == Value->m_ui32NumVariableDatum)) {
    pKVar1 = (this->m_vFixedDatum).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pKVar2 = (this->m_vFixedDatum).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pKVar3 = (Value->m_vFixedDatum).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pKVar2 - (long)pKVar1 ==
        (long)(Value->m_vFixedDatum).
              super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar3) {
      bVar13 = pKVar1 == pKVar2;
      if (!bVar13) {
        if (pKVar1->m_pRef != pKVar3->m_pRef) {
          return false;
        }
        ppFVar11 = &pKVar3[1].m_pRef;
        while( true ) {
          bVar13 = pKVar1 + 1 == pKVar2;
          if (bVar13) break;
          pKVar3 = pKVar1 + 1;
          pFVar4 = *ppFVar11;
          ppFVar11 = ppFVar11 + 3;
          pKVar1 = pKVar1 + 1;
          if (pKVar3->m_pRef != pFVar4) {
            return false;
          }
        }
      }
      if (bVar13) {
        pKVar5 = (this->m_vVariableDatum).
                 super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pKVar6 = (this->m_vVariableDatum).
                 super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pKVar10 = (Value->m_vVariableDatum).
                  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((long)pKVar6 - (long)pKVar5 ==
            (long)(Value->m_vVariableDatum).
                  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar10) {
          if (pKVar5 == pKVar6) {
            return pKVar5 == pKVar6;
          }
          if (pKVar5->m_pRef == pKVar10->m_pRef) {
            ppVVar12 = &pKVar10[1].m_pRef;
            do {
              pKVar10 = pKVar5 + 1;
              if (pKVar10 == pKVar6) {
                return pKVar10 == pKVar6;
              }
              pKVar8 = pKVar5 + 1;
              pVVar7 = *ppVVar12;
              ppVVar12 = ppVVar12 + 3;
              pKVar5 = pKVar10;
            } while (pKVar8->m_pRef == pVVar7);
            return false;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

KBOOL Comment_PDU::operator == ( const Comment_PDU & Value ) const
{
    if( Simulation_Management_Header::operator  !=( Value ) )                     return false;
    if( m_ui32NumFixedDatum                     != Value.m_ui32NumFixedDatum )    return false;
    if( m_ui32NumVariableDatum                  != Value.m_ui32NumVariableDatum ) return false;
    if( m_vFixedDatum                           != Value.m_vFixedDatum )          return false;
    if( m_vVariableDatum                        != Value.m_vVariableDatum )       return false;
    return true;
}